

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

void dis_pp_expr(decoctx *deco,dis_res *dres,easm_expr *expr,uint64_t pos)

{
  uint64_t uVar1;
  easm_expr *peVar2;
  ulong uVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  char *pcVar7;
  easm_expr *peVar8;
  long lVar9;
  uint uVar10;
  byte *pbVar11;
  
  if (expr->e1 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e1,pos);
  }
  if (expr->e2 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e2,pos);
  }
  if (expr->sinsn != (easm_sinsn *)0x0) {
    dis_pp_sinsn(deco,dres,expr->sinsn,pos);
  }
  easm_substpos_expr(expr,pos);
  iVar4 = easm_cfold_expr(expr);
  if (iVar4 != 0) {
    if (expr->special == EASM_SPEC_BTARG) {
      uVar1 = expr->num;
      uVar6 = deco->codebase;
      uVar10 = (uint)uVar1;
      if ((uVar6 <= uVar10) && (uVar10 < uVar6 + deco->codesz)) {
        deco->marks[uVar10 - uVar6] = deco->marks[uVar10 - uVar6] | 1;
      }
      pcVar7 = deco_label(deco,uVar1);
      expr->alabel = pcVar7;
    }
    else if (expr->special == EASM_SPEC_CTARG) {
      uVar1 = expr->num;
      uVar6 = deco->codebase;
      uVar10 = (uint)uVar1;
      if ((uVar6 <= uVar10) && (uVar10 < uVar6 + deco->codesz)) {
        deco->marks[uVar10 - uVar6] = deco->marks[uVar10 - uVar6] | 2;
      }
      pcVar7 = deco_label(deco,uVar1);
      expr->alabel = pcVar7;
      uVar6 = (uint)expr->num;
      uVar10 = deco->codebase;
      if (((uVar10 <= uVar6) && (uVar6 < uVar10 + deco->codesz)) &&
         ((*(byte *)(deco->marks + (uVar6 - uVar10)) & 0x40) != 0)) {
        dres->endmark = 1;
      }
    }
    if (((long)expr->num < 0) && (expr->special == EASM_SPEC_NONE)) {
      expr->type = EASM_EXPR_NEG;
      peVar8 = easm_expr_num(EASM_EXPR_NUM,-expr->num);
      expr->e1 = peVar8;
      expr->num = 0;
    }
  }
  if (((expr->type == EASM_EXPR_ADD) && (peVar8 = expr->e1, peVar8->type == EASM_EXPR_NUM)) &&
     (peVar8->num == 0)) {
    peVar2 = expr->e2;
    free(peVar8);
    memcpy(expr,peVar2,0x88);
    free(peVar2);
  }
  if ((((expr->type & ~EASM_EXPR_LOR) == EASM_EXPR_ADD) &&
      (peVar8 = expr->e2, peVar8->type == EASM_EXPR_NUM)) && (peVar8->num == 0)) {
    peVar2 = expr->e1;
    free(peVar8);
    memcpy(expr,peVar2,0x88);
    free(peVar2);
  }
  if (((expr->type == EASM_EXPR_ADD) && (peVar8 = expr->e2, peVar8->type == EASM_EXPR_NUM)) &&
     ((long)peVar8->num < 0)) {
    peVar8->num = -peVar8->num;
    expr->type = EASM_EXPR_SUB;
  }
  if ((expr->type == EASM_EXPR_MEM) && (expr->special == EASM_SPEC_LITERAL)) {
    if (expr->e1->type == EASM_EXPR_NUM) {
      uVar3 = expr->e1->num;
      uVar6 = deco->codebase;
      uVar10 = (uint)uVar3;
      if ((uVar6 <= uVar10) && (uVar10 < uVar6 + deco->codesz)) {
        deco->marks[uVar10 - uVar6] = deco->marks[uVar10 - uVar6] | 0x10;
      }
      if ((deco->codebase <= uVar3) && (uVar3 <= deco->codebase + deco->codesz)) {
        uVar5 = ed_getcbsz(deco->isa,deco->varinfo);
        if (uVar5 == 8) {
          pbVar11 = deco->code + (uVar3 - deco->codebase);
          lVar9 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 | (uint)*pbVar11 << ((byte)lVar9 & 0x1f);
            lVar9 = lVar9 + 8;
            pbVar11 = pbVar11 + 1;
          } while (lVar9 != 0x20);
          expr->alit = (ulong)uVar6;
          return;
        }
        abort();
      }
    }
    expr->special = EASM_SPEC_NONE;
  }
  return;
}

Assistant:

static void dis_pp_expr(struct decoctx *deco, struct dis_res *dres, struct easm_expr *expr, uint64_t pos) {
	if (expr->e1)
		dis_pp_expr(deco, dres, expr->e1, pos);
	if (expr->e2)
		dis_pp_expr(deco, dres, expr->e2, pos);
	if (expr->sinsn)
		dis_pp_sinsn(deco, dres, expr->sinsn, pos);
	easm_substpos_expr(expr, pos);
	if (easm_cfold_expr(expr)) {
		if (expr->special == EASM_SPEC_CTARG) {
			mark(deco, expr->num, 2);
			expr->alabel = deco_label(deco, expr->num);
			if (is_nr_mark(deco, expr->num))
				dres->endmark = 1;
		} else if (expr->special == EASM_SPEC_BTARG) {
			mark(deco, expr->num, 1);
			expr->alabel = deco_label(deco, expr->num);
		}
		if (expr->num & 1ull << 63 && !expr->special) {
			expr->type = EASM_EXPR_NEG;
			expr->e1 = easm_expr_num(EASM_EXPR_NUM, -expr->num);
			expr->num = 0;
		}
	}
	if (expr->type == EASM_EXPR_ADD && expr->e1->type == EASM_EXPR_NUM && expr->e1->num == 0) {
		struct easm_expr *oe2 = expr->e2;
		free(expr->e1);
		*expr = *oe2;
		free(oe2);
	}
	if ((expr->type == EASM_EXPR_ADD || expr->type == EASM_EXPR_SUB) && expr->e2->type == EASM_EXPR_NUM && expr->e2->num == 0) {
		struct easm_expr *oe1 = expr->e1;
		free(expr->e2);
		*expr = *oe1;
		free(oe1);
	}
	if (expr->type == EASM_EXPR_ADD && expr->e2->type == EASM_EXPR_NUM && expr->e2->num & 1ull << 63) {
		expr->e2->num = -expr->e2->num;
		expr->type = EASM_EXPR_SUB;
	}
	if (expr->type == EASM_EXPR_MEM && expr->special == EASM_SPEC_LITERAL) {
		if (expr->e1->type != EASM_EXPR_NUM) {
			expr->special = EASM_SPEC_NONE;
		} else {
			ull ptr = expr->e1->num;
			mark(deco, ptr, 0x10);
			if (ptr < deco->codebase || ptr > deco->codebase + deco->codesz) {
				expr->special = EASM_SPEC_NONE;
			} else {
				if (ed_getcbsz(deco->isa, deco->varinfo) != 8)
					abort();
				uint32_t num = 0;
				int j;
				for (j = 0; j < 4; j++)
					num |= deco->code[ptr - deco->codebase + j] << j*8;
				expr->alit = num;
			}
		}
	}
}